

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply_sdf.cpp
# Opt level: O0

void sdf_tools::evaluateAtGridPointsPeriodic(SdfVar *sdfVar,Grid *grid)

{
  anon_class_8_1_898c3844 *in_RSI;
  anon_class_8_1_898c3844 visitor;
  
  std::
  visit<sdf_tools::evaluateAtGridPointsPeriodic(std::variant<sdf_tools::sdf::SdfBox,sdf_tools::sdf::SdfCapsule,sdf_tools::sdf::SdfEdges,sdf_tools::sdf::SdfPiecewisePipe,sdf_tools::sdf::SdfPlate,sdf_tools::sdf::SdfSphere,sdf_tools::sdf::SdfFromMesh>const&,sdf_tools::Grid*)::__0&,std::variant<sdf_tools::sdf::SdfBox,sdf_tools::sdf::SdfCapsule,sdf_tools::sdf::SdfEdges,sdf_tools::sdf::SdfPiecewisePipe,sdf_tools::sdf::SdfPlate,sdf_tools::sdf::SdfSphere,sdf_tools::sdf::SdfFromMesh>const&>
            (in_RSI,(variant<sdf_tools::sdf::SdfBox,_sdf_tools::sdf::SdfCapsule,_sdf_tools::sdf::SdfEdges,_sdf_tools::sdf::SdfPiecewisePipe,_sdf_tools::sdf::SdfPlate,_sdf_tools::sdf::SdfSphere,_sdf_tools::sdf::SdfFromMesh>
                     *)in_RSI);
  return;
}

Assistant:

void evaluateAtGridPointsPeriodic(const sdf::SdfVar& sdfVar, Grid *grid)
{
    auto visitor = [grid](const auto& sdf)
    {
        const real3 extents = grid->getExtents();
        auto applySdfPeriodic = [sdf,extents](real3 r, real& gridValue)
        {
            real s = sdf.at(r);

            for (int dz = -1; dz <= 1; ++dz) {
                for (int dy = -1; dy <= 1; ++dy) {
                    for (int dx = -1; dx <= 1; ++dx) {
                        if (dz == 0 && dy == 0 && dx == 0)
                            continue;

                        const real3 rImage {r.x + dx * extents.x,
                                            r.y + dy * extents.y,
                                            r.z + dz * extents.z};

                        s = sdf::operations::Union{}(s, sdf.at(rImage));
                    }
                }
            }
            gridValue = s;
        };
        gridForEachPoint(applySdfPeriodic, grid);
    };

    std::visit(visitor, sdfVar);
}